

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O3

wchar_t archive_read_format_zip_seekable_bid(archive_read *a,wchar_t best_bid)

{
  int *p;
  byte bVar1;
  zip *zip;
  wchar_t wVar2;
  wchar_t wVar3;
  ulong uVar4;
  int64_t iVar5;
  void *pvVar6;
  int iVar7;
  uint uVar8;
  size_t min;
  bool bVar9;
  
  wVar2 = L'\xffffffff';
  if (best_bid < L'!') {
    zip = (zip *)a->format->data;
    uVar4 = __archive_read_seek(a,0,2);
    wVar2 = L'\0';
    if (0 < (long)uVar4) {
      min = 0x4000;
      if (uVar4 < 0x4000) {
        min = uVar4;
      }
      iVar5 = __archive_read_seek(a,(long)-(int)min,2);
      wVar2 = L'\0';
      if (-1 < iVar5) {
        wVar2 = L'\0';
        pvVar6 = __archive_read_ahead(a,min,(ssize_t *)0x0);
        if (0x16 < uVar4 && pvVar6 != (void *)0x0) {
          uVar8 = (int)min - 0x16;
          do {
            uVar4 = (ulong)uVar8;
            bVar1 = *(byte *)((long)pvVar6 + uVar4);
            if (bVar1 < 0x4b) {
              if (bVar1 == 5) {
                iVar7 = -2;
              }
              else if (bVar1 == 6) {
                iVar7 = -3;
              }
              else {
LAB_00139af2:
                iVar7 = -4;
              }
            }
            else if (bVar1 == 0x4b) {
              iVar7 = -1;
            }
            else {
              if (bVar1 != 0x50) goto LAB_00139af2;
              p = (int *)((long)pvVar6 + uVar4);
              iVar7 = -4;
              if (*p == 0x6054b50) {
                wVar2 = read_eocd(zip,(char *)p,iVar5 + uVar4);
                if (uVar8 < 0x14) {
                  return wVar2;
                }
                if (p[-5] != 0x7064b50) {
                  return wVar2;
                }
                wVar3 = read_zip64_eocd(a,zip,(char *)(p + -5));
                if ((uint)wVar2 < (uint)wVar3) {
                  return wVar3;
                }
                return wVar2;
              }
            }
            bVar9 = SCARRY4(uVar8,iVar7);
            uVar8 = uVar8 + iVar7;
          } while (uVar8 != 0 && bVar9 == (int)uVar8 < 0);
        }
      }
    }
  }
  return wVar2;
}

Assistant:

static int
archive_read_format_zip_seekable_bid(struct archive_read *a, int best_bid)
{
	struct zip *zip = (struct zip *)a->format->data;
	int64_t file_size, current_offset;
	const char *p;
	int i, tail;

	/* If someone has already bid more than 32, then avoid
	   trashing the look-ahead buffers with a seek. */
	if (best_bid > 32)
		return (-1);

	file_size = __archive_read_seek(a, 0, SEEK_END);
	if (file_size <= 0)
		return 0;

	/* Search last 16k of file for end-of-central-directory
	 * record (which starts with PK\005\006) */
	tail = (int)zipmin(1024 * 16, file_size);
	current_offset = __archive_read_seek(a, -tail, SEEK_END);
	if (current_offset < 0)
		return 0;
	if ((p = __archive_read_ahead(a, (size_t)tail, NULL)) == NULL)
		return 0;
	/* Boyer-Moore search backwards from the end, since we want
	 * to match the last EOCD in the file (there can be more than
	 * one if there is an uncompressed Zip archive as a member
	 * within this Zip archive). */
	for (i = tail - 22; i > 0;) {
		switch (p[i]) {
		case 'P':
			if (memcmp(p + i, "PK\005\006", 4) == 0) {
				int ret = read_eocd(zip, p + i,
				    current_offset + i);
				/* Zip64 EOCD locator precedes
				 * regular EOCD if present. */
				if (i >= 20 && memcmp(p + i - 20, "PK\006\007", 4) == 0) {
					int ret_zip64 = read_zip64_eocd(a, zip, p + i - 20);
					if (ret_zip64 > ret)
						ret = ret_zip64;
				}
				return (ret);
			}
			i -= 4;
			break;
		case 'K': i -= 1; break;
		case 005: i -= 2; break;
		case 006: i -= 3; break;
		default: i -= 4; break;
		}
	}
	return 0;
}